

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

string * duckdb::SanitizeValue(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  string *psVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string local_80;
  string local_60;
  string local_40;
  
  StringUtil::RTrim((string *)input);
  pcVar1 = (input->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + input->_M_string_length);
  local_40.field_2._M_allocated_capacity._0_2_ = 0;
  local_40._M_string_length = 1;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\\0","");
  psVar2 = (string *)
           StringUtil::Replace((string *)__return_storage_ptr__,&local_60,&local_40,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
    psVar2 = (string *)extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    psVar2 = (string *)extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    psVar2 = extraout_RAX_01;
  }
  return psVar2;
}

Assistant:

static string SanitizeValue(string input) {
	// some results might contain padding spaces, e.g. when rendering
	// VARCHAR(10) and the string only has 6 characters, they will be padded
	// with spaces to 10 in the rendering. We don't do that here yet as we
	// are looking at internal structures. So just ignore any extra spaces
	// on the right
	StringUtil::RTrim(input);
	// for result checking code, replace null bytes with their escaped value (\0)
	return StringUtil::Replace(input, string("\0", 1), "\\0");
}